

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_file_readAsString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  FILE *__stream;
  JSRuntime *opaque;
  ulong uVar2;
  ulong uVar3;
  int64_t iVar4;
  uint64_t uVar5;
  JSValue JVar6;
  JSValue JVar7;
  uint64_t max_size64;
  DynBuf dbuf;
  uint64_t local_68;
  DynBuf local_60;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  iVar4 = 6;
  if ((__stream == (FILE *)0x0) ||
     (((uVar5 = 0xffffffffffffffff, 0 < argc && ((int)argv->tag != 3)) &&
      (JVar6.tag = argv->tag, JVar6.u.ptr = (argv->u).ptr, iVar1 = JS_ToIndex(ctx,&local_68,JVar6),
      uVar5 = local_68, iVar1 != 0)))) {
LAB_0010fcdc:
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    opaque = JS_GetRuntime(ctx);
    dbuf_init2(&local_60,opaque,js_realloc_rt);
    if (uVar5 != 0) {
      do {
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        iVar1 = dbuf_putc(&local_60,(uint8_t)iVar1);
        if (iVar1 != 0) {
          dbuf_free(&local_60);
          goto LAB_0010fcdc;
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    JVar6 = JS_NewStringLen(ctx,(char *)local_60.buf,local_60.size);
    iVar4 = JVar6.tag;
    dbuf_free(&local_60);
    uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
    uVar2 = (ulong)JVar6.u.ptr & 0xffffffff;
  }
  JVar7.u.ptr = (void *)(uVar2 | uVar3);
  JVar7.tag = iVar4;
  return JVar7;
}

Assistant:

static JSValue js_std_file_readAsString(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    uint64_t max_size64;
    size_t max_size;
    JSValueConst max_size_val;
    
    if (!f)
        return JS_EXCEPTION;

    if (argc >= 1)
        max_size_val = argv[0];
    else
        max_size_val = JS_UNDEFINED;
    max_size = (size_t)-1;
    if (!JS_IsUndefined(max_size_val)) {
        if (JS_ToIndex(ctx, &max_size64, max_size_val))
            return JS_EXCEPTION;
        if (max_size64 < max_size)
            max_size = max_size64;
    }

    js_std_dbuf_init(ctx, &dbuf);
    while (max_size != 0) {
        c = fgetc(f);
        if (c == EOF)
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_EXCEPTION;
        }
        max_size--;
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}